

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

bool ASDCP::MXF::decode_mca_string
               (string *s,mca_label_map_t *labels,Dictionary *dict,string *language,
               InterchangeObject_list_t *descriptor_list,ui32_t *channel_count)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  iterator iVar6;
  SoundfieldGroupLabelSubDescriptor *this;
  key_type *pkVar7;
  const_iterator cVar8;
  SoundfieldGroupLabelSubDescriptor *pSVar9;
  ILogSink *pIVar10;
  char *pcVar11;
  char cVar12;
  char *pcVar13;
  sfg_map_t used_soundfields;
  undefined1 local_100 [40];
  key_type local_d8;
  uint *local_b8;
  string *local_b0;
  InterchangeObject_list_t *local_a8;
  Dictionary *local_a0;
  _Base_ptr local_98;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
  *local_90;
  SoundfieldGroupLabelSubDescriptor *local_88;
  string local_80;
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
  local_60;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_88 = (SoundfieldGroupLabelSubDescriptor *)0x0;
  local_80.field_2._M_local_buf[0] = '\0';
  *channel_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar11 = (s->_M_dataplus)._M_p;
  local_98 = &(labels->_M_t)._M_impl.super__Rb_tree_header._M_header;
  this = (SoundfieldGroupLabelSubDescriptor *)0x0;
  pcVar13 = pcVar11;
  local_b8 = channel_count;
  local_b0 = language;
  local_a8 = descriptor_list;
  local_a0 = dict;
  local_90 = &labels->_M_t;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0019a2e2:
  if (pcVar13 == pcVar11 + s->_M_string_length) goto LAB_0019a875;
  cVar12 = *pcVar13;
  switch(cVar12) {
  case '(':
    if (this != (SoundfieldGroupLabelSubDescriptor *)0x0) {
      if (local_d8._M_string_length == 0) break;
      pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar11 = "Encountered \'(\', already processing a soundfield group.\n";
      goto LAB_0019aa73;
    }
    if (local_d8._M_string_length != 0) {
      cVar8 = std::
              _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
              ::find(local_90,&local_d8);
      if (cVar8._M_node == local_98) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = "Unknown symbol: \'%s\'\n";
      }
      else {
        if (*(char *)((long)&cVar8._M_node[3]._M_right + 3) == '\x02') {
          iVar6 = std::
                  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
                  ::find(&local_60,&local_d8);
          if ((_Rb_tree_header *)iVar6._M_node == &local_60._M_impl.super__Rb_tree_header) {
            this = (SoundfieldGroupLabelSubDescriptor *)operator_new(0x318);
            SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor(this,local_a0);
            Kumu::GenRandomValue(&(this->super_MCALabelSubDescriptor).MCALinkID);
            pcVar11 = "";
            if ((char)cVar8._M_node[3]._M_color != _S_red) {
              pcVar11 = "sg";
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,pcVar11,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (cVar8._M_node + 1));
            UTF16String::operator=
                      (&(this->super_MCALabelSubDescriptor).MCATagSymbol,(string *)local_100);
            std::__cxx11::string::~string((string *)local_100);
            UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar8._M_node + 2));
            optional_property<ASDCP::MXF::UTF16String>::operator=
                      (&(this->super_MCALabelSubDescriptor).MCATagName,(UTF16String *)local_100);
            std::__cxx11::string::~string((string *)(local_100 + 8));
            ISO8String::ISO8String((ISO8String *)local_100,local_b0);
            optional_property<ASDCP::MXF::ISO8String>::operator=
                      (&(this->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,
                       (ISO8String *)local_100);
            std::__cxx11::string::~string((string *)(local_100 + 8));
            (this->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
            m_HasValue = *(bool *)&cVar8._M_node[3]._M_left;
            uVar2 = *(undefined8 *)((long)&cVar8._M_node[3]._M_right + 1);
            *(undefined8 *)
             (this->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
                 = *(undefined8 *)((long)&cVar8._M_node[3]._M_left + 1);
            *(undefined8 *)
             ((this->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
             + 8) = uVar2;
            local_100._0_8_ = this;
            std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::push_back(local_a8,(value_type *)local_100);
            pkVar7 = &local_d8;
            local_88 = this;
          }
          else {
            this = *(SoundfieldGroupLabelSubDescriptor **)(iVar6._M_node + 2);
            pkVar7 = &local_d8;
          }
          goto LAB_0019a85f;
        }
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = "Not a soundfield group symbol: \'%s\'\n";
      }
      bVar3 = false;
      Kumu::ILogSink::Error(pIVar10,pcVar11,local_d8._M_dataplus._M_p);
      goto LAB_0019ab27;
    }
    this = local_88;
    if (local_88 != (SoundfieldGroupLabelSubDescriptor *)0x0) break;
    pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
    pcVar11 = "Encountered \'(\', without leading soundfield group symbol.\n";
    goto LAB_0019aa73;
  case ')':
    if (this == (SoundfieldGroupLabelSubDescriptor *)0x0) {
      pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar11 = "Encountered \')\', not currently processing a soundfield group.\n";
    }
    else {
      if (local_d8._M_string_length != 0) {
        cVar8 = std::
                _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
                ::find(local_90,&local_d8);
        if (cVar8._M_node != local_98) {
          pSVar9 = (SoundfieldGroupLabelSubDescriptor *)operator_new(0x318);
          AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor
                    ((AudioChannelLabelSubDescriptor *)pSVar9,local_a0);
          Kumu::GenRandomValue(&(pSVar9->super_MCALabelSubDescriptor).MCALinkID);
          ((Identifier<16U> *)
          &(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
           super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>)->
          m_HasValue = (this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.
                       m_HasValue;
          uVar2 = *(undefined8 *)
                   ((this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value + 8)
          ;
          *(undefined8 *)
           ((Identifier<16U> *)
           &(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
            super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>)->
           m_Value = *(undefined8 *)
                      (this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value;
          *(undefined8 *)
           (((Identifier<16U> *)
            &(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
             super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>)->
            m_Value + 8) = uVar2;
          (pSVar9->GroupOfSoundfieldGroupsLinkID).m_has_value = true;
          uVar1 = *local_b8;
          *local_b8 = uVar1 + 1;
          (pSVar9->super_MCALabelSubDescriptor).MCAChannelID.m_property = uVar1 + 1;
          (pSVar9->super_MCALabelSubDescriptor).MCAChannelID.m_has_value = true;
          pcVar11 = "";
          if ((char)cVar8._M_node[3]._M_color != _S_red) {
            pcVar11 = "ch";
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,pcVar11,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (cVar8._M_node + 1));
          UTF16String::operator=
                    (&(pSVar9->super_MCALabelSubDescriptor).MCATagSymbol,(string *)local_100);
          std::__cxx11::string::~string((string *)local_100);
          UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar8._M_node + 2));
          optional_property<ASDCP::MXF::UTF16String>::operator=
                    (&(pSVar9->super_MCALabelSubDescriptor).MCATagName,(UTF16String *)local_100);
          std::__cxx11::string::~string((string *)(local_100 + 8));
          ISO8String::ISO8String((ISO8String *)local_100,local_b0);
          optional_property<ASDCP::MXF::ISO8String>::operator=
                    (&(pSVar9->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,
                     (ISO8String *)local_100);
          std::__cxx11::string::~string((string *)(local_100 + 8));
          (pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
          m_HasValue = *(bool *)&cVar8._M_node[3]._M_left;
          uVar2 = *(undefined8 *)((long)&cVar8._M_node[3]._M_right + 1);
          *(undefined8 *)
           (pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
               = *(undefined8 *)((long)&cVar8._M_node[3]._M_left + 1);
          *(undefined8 *)
           ((pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
           + 8) = uVar2;
          local_100._0_8_ = pSVar9;
          std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          push_back(local_a8,(value_type *)local_100);
          pkVar7 = &local_d8;
          this = (SoundfieldGroupLabelSubDescriptor *)0x0;
          goto LAB_0019a85f;
        }
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        bVar3 = false;
        Kumu::ILogSink::Error(pIVar10,"Unknown symbol: \'%s\'\n",local_d8._M_dataplus._M_p);
        goto LAB_0019ab27;
      }
      pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar11 = "Soundfield group description contains no channels.\n";
    }
LAB_0019aa73:
    bVar3 = false;
    Kumu::ILogSink::Error(pIVar10,pcVar11);
    goto LAB_0019ab27;
  case '*':
  case '+':
switchD_0019a30c_caseD_2a:
    iVar5 = isalnum((int)cVar12);
    if (iVar5 != 0) goto switchD_0019a30c_caseD_2d;
    iVar5 = isspace((int)cVar12);
    if (iVar5 == 0) {
      pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
      bVar3 = false;
      Kumu::ILogSink::Error(pIVar10,"Unexpected character \'%c\'.\n",(ulong)(uint)(int)*pcVar13);
      goto LAB_0019ab27;
    }
    break;
  case ',':
    if (local_d8._M_string_length != 0) {
      pkVar7 = &local_d8;
      iVar5 = std::__cxx11::string::compare((char *)pkVar7);
      if (iVar5 == 0) {
        *local_b8 = *local_b8 + 1;
LAB_0019a85f:
        pkVar7->_M_string_length = 0;
        *(pkVar7->_M_dataplus)._M_p = '\0';
      }
      else if (local_d8._M_string_length != 0) {
        cVar8 = std::
                _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
                ::find(local_90,&local_d8);
        if (cVar8._M_node == local_98) {
          pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
          pcVar11 = "Unknown symbol: \'%s\'\n";
        }
        else {
          bVar3 = ul_is_an_mca_channel((UL *)&cVar8._M_node[3]._M_parent);
          if (bVar3) {
            pSVar9 = (SoundfieldGroupLabelSubDescriptor *)operator_new(0x318);
            AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor
                      ((AudioChannelLabelSubDescriptor *)pSVar9,local_a0);
            Kumu::GenRandomValue(&(pSVar9->super_MCALabelSubDescriptor).MCALinkID);
            if (this != (SoundfieldGroupLabelSubDescriptor *)0x0) {
              ((Identifier<16U> *)
              &(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
               super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>)
              ->m_HasValue = (this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.
                             m_HasValue;
              uVar2 = *(undefined8 *)
                       ((this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value
                       + 8);
              *(undefined8 *)
               ((Identifier<16U> *)
               &(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
                super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
               )->m_Value = *(undefined8 *)
                             (this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.
                             m_Value;
              *(undefined8 *)
               (((Identifier<16U> *)
                &(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
                 super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                )->m_Value + 8) = uVar2;
              (pSVar9->GroupOfSoundfieldGroupsLinkID).m_has_value = true;
            }
            uVar1 = *local_b8;
            *local_b8 = uVar1 + 1;
            (pSVar9->super_MCALabelSubDescriptor).MCAChannelID.m_property = uVar1 + 1;
            (pSVar9->super_MCALabelSubDescriptor).MCAChannelID.m_has_value = true;
            pcVar11 = "";
            if ((char)cVar8._M_node[3]._M_color != _S_red) {
              pcVar11 = "ch";
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,pcVar11,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (cVar8._M_node + 1));
            UTF16String::operator=
                      (&(pSVar9->super_MCALabelSubDescriptor).MCATagSymbol,(string *)local_100);
            std::__cxx11::string::~string((string *)local_100);
            UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar8._M_node + 2));
            optional_property<ASDCP::MXF::UTF16String>::operator=
                      (&(pSVar9->super_MCALabelSubDescriptor).MCATagName,(UTF16String *)local_100);
            std::__cxx11::string::~string((string *)(local_100 + 8));
            if (local_80._M_string_length == 0) {
              ISO8String::ISO8String((ISO8String *)local_100,local_b0);
              optional_property<ASDCP::MXF::ISO8String>::operator=
                        (&(pSVar9->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,
                         (ISO8String *)local_100);
            }
            else {
              ISO8String::ISO8String((ISO8String *)local_100,&local_80);
              optional_property<ASDCP::MXF::ISO8String>::operator=
                        (&(pSVar9->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,
                         (ISO8String *)local_100);
            }
            std::__cxx11::string::~string((string *)(local_100 + 8));
            (pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
            m_HasValue = *(bool *)&cVar8._M_node[3]._M_left;
            uVar2 = *(undefined8 *)((long)&cVar8._M_node[3]._M_right + 1);
            *(undefined8 *)
             (pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
             m_Value = *(undefined8 *)((long)&cVar8._M_node[3]._M_left + 1);
            *(undefined8 *)
             ((pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
              m_Value + 8) = uVar2;
            local_100._0_8_ = pSVar9;
            std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::push_back(local_a8,(value_type *)local_100);
            local_d8._M_string_length = 0;
            *local_d8._M_dataplus._M_p = '\0';
            pkVar7 = &local_80;
            goto LAB_0019a85f;
          }
          pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
          pcVar11 = "Not a channel symbol: \'%s\'\n";
        }
        bVar3 = false;
        Kumu::ILogSink::Error(pIVar10,pcVar11,local_d8._M_dataplus._M_p);
        goto LAB_0019ab27;
      }
    }
    break;
  case '-':
switchD_0019a30c_caseD_2d:
    cVar12 = (char)&local_d8;
    if (local_80._M_string_length != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar5 == 0) {
        local_80._M_string_length = 0;
        *local_80._M_dataplus._M_p = '\0';
      }
      goto LAB_0019a398;
    }
    goto LAB_0019a3a3;
  default:
    if (cVar12 != ':') goto switchD_0019a30c_caseD_2a;
    iVar5 = std::__cxx11::string::compare((char *)&local_d8);
    if (iVar5 != 0) {
      pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar11 = "Channel specific language may only be used with SLVS tag\n";
      goto LAB_0019aa73;
    }
LAB_0019a398:
    cVar12 = (char)&local_80;
LAB_0019a3a3:
    std::__cxx11::string::push_back(cVar12);
  }
  pcVar13 = pcVar13 + 1;
  pcVar11 = (s->_M_dataplus)._M_p;
  goto LAB_0019a2e2;
LAB_0019a875:
  bVar3 = true;
  if (local_d8._M_string_length != 0) {
    iVar5 = std::__cxx11::string::compare((char *)&local_d8);
    if (iVar5 == 0) {
      *local_b8 = *local_b8 + 1;
    }
    else if (local_d8._M_string_length != 0) {
      cVar8 = std::
              _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
              ::find(local_90,&local_d8);
      if (cVar8._M_node == local_98) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = "Unknown symbol: \'%s\'\n";
      }
      else {
        bVar4 = ul_is_an_mca_channel((UL *)&cVar8._M_node[3]._M_parent);
        if (bVar4) {
          pSVar9 = (SoundfieldGroupLabelSubDescriptor *)operator_new(0x318);
          AudioChannelLabelSubDescriptor::AudioChannelLabelSubDescriptor
                    ((AudioChannelLabelSubDescriptor *)pSVar9,local_a0);
          Kumu::GenRandomValue(&(pSVar9->super_MCALabelSubDescriptor).MCALinkID);
          if (this != (SoundfieldGroupLabelSubDescriptor *)0x0) {
            *(bool *)&(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
                      super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                      .super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
                      super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
                      super__Vector_impl_data._M_start =
                 (this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_HasValue;
            uVar2 = *(undefined8 *)
                     ((this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value +
                     8);
            *(undefined8 *)
             ((long)&(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
                     super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                     .super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
                     super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
                     super__Vector_impl_data + 1) =
                 *(undefined8 *)
                  (this->super_MCALabelSubDescriptor).MCALinkID.super_Identifier<16U>.m_Value;
            *(undefined8 *)
             ((long)&(pSVar9->GroupOfSoundfieldGroupsLinkID).m_property.
                     super_FixedSizeItemCollection<std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>_>
                     .super_vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>.
                     super__Vector_base<Kumu::UUID,_std::allocator<Kumu::UUID>_>._M_impl.
                     super__Vector_impl_data + 9) = uVar2;
            (pSVar9->GroupOfSoundfieldGroupsLinkID).m_has_value = true;
          }
          uVar1 = *local_b8;
          *local_b8 = uVar1 + 1;
          (pSVar9->super_MCALabelSubDescriptor).MCAChannelID.m_property = uVar1 + 1;
          (pSVar9->super_MCALabelSubDescriptor).MCAChannelID.m_has_value = true;
          pcVar11 = "";
          if ((char)cVar8._M_node[3]._M_color != _S_red) {
            pcVar11 = "ch";
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,pcVar11,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (cVar8._M_node + 1));
          UTF16String::operator=
                    (&(pSVar9->super_MCALabelSubDescriptor).MCATagSymbol,(string *)local_100);
          std::__cxx11::string::~string((string *)local_100);
          UTF16String::UTF16String((UTF16String *)local_100,(string *)(cVar8._M_node + 2));
          optional_property<ASDCP::MXF::UTF16String>::operator=
                    (&(pSVar9->super_MCALabelSubDescriptor).MCATagName,(UTF16String *)local_100);
          std::__cxx11::string::~string((string *)(local_100 + 8));
          ISO8String::ISO8String((ISO8String *)local_100,local_b0);
          optional_property<ASDCP::MXF::ISO8String>::operator=
                    (&(pSVar9->super_MCALabelSubDescriptor).RFC5646SpokenLanguage,
                     (ISO8String *)local_100);
          std::__cxx11::string::~string((string *)(local_100 + 8));
          (pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.
          m_HasValue = *(bool *)&cVar8._M_node[3]._M_left;
          uVar2 = *(undefined8 *)((long)&cVar8._M_node[3]._M_right + 1);
          *(undefined8 *)
           (pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
               = *(undefined8 *)((long)&cVar8._M_node[3]._M_left + 1);
          *(undefined8 *)
           ((pSVar9->super_MCALabelSubDescriptor).MCALabelDictionaryID.super_Identifier<16U>.m_Value
           + 8) = uVar2;
          local_100._0_8_ = pSVar9;
          std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          push_back(local_a8,(value_type *)local_100);
          goto LAB_0019ab27;
        }
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = "Not a channel symbol: \'%s\'\n";
      }
      bVar3 = false;
      Kumu::ILogSink::Error(pIVar10,pcVar11,local_d8._M_dataplus._M_p);
    }
  }
LAB_0019ab27:
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ASDCP::MXF::SoundfieldGroupLabelSubDescriptor_*>_>_>
  ::~_Rb_tree(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d8);
  return bVar3;
}

Assistant:

bool
ASDCP::MXF::decode_mca_string(const std::string& s, const mca_label_map_t& labels, const Dictionary* dict, const std::string& language,
			      InterchangeObject_list_t& descriptor_list, ui32_t& channel_count)
{
  typedef std::map<const std::string, ASDCP::MXF::SoundfieldGroupLabelSubDescriptor *, ci_comp> sfg_map_t;
  std::string symbol_buf;
  std::string current_language;
  channel_count = 0;
  ASDCP::MXF::SoundfieldGroupLabelSubDescriptor *current_soundfield = 0, *prev_soundfield = 0;
  std::string::const_iterator i;
  sfg_map_t used_soundfields; /* Track old soundfields, so that they can be reused. This allows
                                 for the following type of layout:
                                 71(L,R,C,LFE,Lss,Rss),HI,VIN,-,-,71(Lrs,Rrs),DBOX,-  */

  for ( i = s.begin(); i != s.end(); ++i )
    {
      if ( *i == '(' )
	{
	  if ( current_soundfield != 0 && symbol_buf.empty() )
	    {
	      // appending to the existing soundfield group
	      continue;
	    }
	  else if ( current_soundfield != 0 )
	    {
	      DefaultLogSink().Error("Encountered '(', already processing a soundfield group.\n");
	      return false;
	    }
	  else if ( symbol_buf.empty() )
	    {
	      if ( prev_soundfield != 0 )
		{
		  current_soundfield = prev_soundfield;
		  // appending to the existing soundfield group
		  continue;
		}
	      else
		{
		  DefaultLogSink().Error("Encountered '(', without leading soundfield group symbol.\n");
		  return false;
		}
	    }

	  mca_label_map_t::const_iterator i = labels.find(symbol_buf);

	  if ( i == labels.end() )
	    {
	      DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }
      
	  if ( ! ul_is_an_mca_group(i->second.ul) )
	    {
	      DefaultLogSink().Error("Not a soundfield group symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }

	  sfg_map_t::const_iterator ui = used_soundfields.find(symbol_buf);
	  if ( ui != used_soundfields.end() )
	    {
	      current_soundfield = ui->second;  // reuse the old soundfield.
	    }
	  else
	    {
	      current_soundfield = new ASDCP::MXF::SoundfieldGroupLabelSubDescriptor(dict);
	      GenRandomValue(current_soundfield->MCALinkID);

	      current_soundfield->MCATagSymbol = (i->second.requires_prefix ? "sg" : "") + i->first;
	      current_soundfield->MCATagName = i->second.tag_name;
	      current_soundfield->RFC5646SpokenLanguage = language;
	      current_soundfield->MCALabelDictionaryID = i->second.ul;
	      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(current_soundfield));
	      prev_soundfield = current_soundfield;
	    }
	  symbol_buf.clear();
	}
      else if ( *i == ')' )
	{
	  if ( current_soundfield == 0 )
	    {
	      DefaultLogSink().Error("Encountered ')', not currently processing a soundfield group.\n");
	      return false;
	    }

	  if ( symbol_buf.empty() )
	    {
	      DefaultLogSink().Error("Soundfield group description contains no channels.\n");
	      return false;
	    }

	  mca_label_map_t::const_iterator i = labels.find(symbol_buf);
      
	  if ( i == labels.end() )
	    {
	      DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	      return false;
	    }

	  assert(current_soundfield);

	  ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
	    new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
	  GenRandomValue(channel_descr->MCALinkID);

	  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
	  channel_descr->MCAChannelID = channel_count++ + 1;
	  channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
	  channel_descr->MCATagName = i->second.tag_name;
	  channel_descr->RFC5646SpokenLanguage = language;
	  channel_descr->MCALabelDictionaryID = i->second.ul;
	  descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
	  symbol_buf.clear();
	  current_soundfield = 0;
	}
      else if ( *i == ':' )
        {
          // Limits the usage to the SLVS channel, but can easily be extended to set individual languages, or soundfield group languages
          if ( symbol_buf.compare("SLVS") != 0 ) {
            DefaultLogSink().Error("Channel specific language may only be used with SLVS tag\n");
            return false;
          }
          current_language += *i;
        }
      else if ( *i == ',' )
	{
	  if ( ! symbol_buf.empty() && ! symbol_buf.compare("-") )
	    {
	      channel_count++;
	      symbol_buf.clear();
	    }
	  else if ( ! symbol_buf.empty() )
	    {
	      mca_label_map_t::const_iterator i = labels.find(symbol_buf);

	      if ( i == labels.end() )
		{
		  DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
		  return false;
		}

	      if ( ! ul_is_an_mca_channel(i->second.ul) )
		{
		  DefaultLogSink().Error("Not a channel symbol: '%s'\n", symbol_buf.c_str());
		  return false;
		}

	      ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
		new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
	      GenRandomValue(channel_descr->MCALinkID);

	      if ( current_soundfield != 0 )
		{
		  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
		}

	      channel_descr->MCAChannelID = channel_count++ + 1;
	      channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
	      channel_descr->MCATagName = i->second.tag_name;
              if ( current_language.empty() )
                {
        	  channel_descr->RFC5646SpokenLanguage = language;
                }
              else
                {
                  channel_descr->RFC5646SpokenLanguage = current_language;
                }
	      channel_descr->MCALabelDictionaryID = i->second.ul;
	      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
	      symbol_buf.clear();
              current_language.clear();
	    }
	}
      else if ( *i == '-' || isalnum(*i) )
	{
          if ( ! current_language.empty() ) 
            {
              if ( current_language.compare(":") == 0)
                {
                  current_language.clear();
                }
              current_language += *i;
            }
          else
            {
	      symbol_buf += *i;
            }
	}
      else if ( ! isspace(*i) )
	{
	  DefaultLogSink().Error("Unexpected character '%c'.\n", *i);
	  return false;
	}
    }

  if ( ! symbol_buf.empty() && ! symbol_buf.compare("-")  )
    {
      channel_count++;
    }
  else if ( ! symbol_buf.empty() )
    {
      mca_label_map_t::const_iterator i = labels.find(symbol_buf);
      
      if ( i == labels.end() )
	{
	  DefaultLogSink().Error("Unknown symbol: '%s'\n", symbol_buf.c_str());
	  return false;
	}

      if ( ! ul_is_an_mca_channel(i->second.ul) )
	{
	  DefaultLogSink().Error("Not a channel symbol: '%s'\n", symbol_buf.c_str());
	  return false;
	}

      ASDCP::MXF::AudioChannelLabelSubDescriptor *channel_descr =
	new ASDCP::MXF::AudioChannelLabelSubDescriptor(dict);
      GenRandomValue(channel_descr->MCALinkID);

      if ( current_soundfield != 0 )
	{
	  channel_descr->SoundfieldGroupLinkID = current_soundfield->MCALinkID;
	}

      channel_descr->MCAChannelID = channel_count++ + 1;
      channel_descr->MCATagSymbol = (i->second.requires_prefix ? "ch" : "") + i->first;
      channel_descr->MCATagName = i->second.tag_name;
      channel_descr->RFC5646SpokenLanguage = language;
      channel_descr->MCALabelDictionaryID = i->second.ul;
      descriptor_list.push_back(reinterpret_cast<ASDCP::MXF::InterchangeObject*>(channel_descr));
    }

  return true;
}